

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention.cc
# Opt level: O0

MethodOptions *
google::protobuf::compiler::StripLocalSourceRetentionOptions
          (MethodOptions *__return_storage_ptr__,MethodDescriptor *descriptor)

{
  MethodDescriptor *descriptor_local;
  
  anon_unknown_0::StripLocalOptions<google::protobuf::MethodDescriptor>
            (__return_storage_ptr__,descriptor);
  return __return_storage_ptr__;
}

Assistant:

MethodOptions StripLocalSourceRetentionOptions(
    const MethodDescriptor& descriptor) {
  return StripLocalOptions(descriptor);
}